

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * bsim::andr(quad_value_bit_vector *a)

{
  bool bVar1;
  int iVar2;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  undefined7 in_stack_ffffffffffffff58;
  uchar in_stack_ffffffffffffff5f;
  quad_value *in_stack_ffffffffffffff60;
  allocator *paVar3;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  quad_value_bit_vector *in_stack_ffffffffffffffe0;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar2 = quad_value_bit_vector::bitLength(in_RSI);
    if (iVar2 <= local_14) {
      paVar3 = &local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"1",paVar3);
      quad_value_bit_vector::quad_value_bit_vector
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      return in_RDI;
    }
    quad_value_bit_vector::get
              ((quad_value_bit_vector *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),0);
    quad_value::quad_value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    bVar1 = operator!=(in_stack_ffffffffffffff60,
                       (quad_value *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"0",&local_39);
  quad_value_bit_vector::quad_value_bit_vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

static inline quad_value_bit_vector
  andr(const quad_value_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) != 1) {
	return quad_value_bit_vector(1, "0");
      }
    }

    return quad_value_bit_vector(1, "1");
  }